

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_relation.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateViewRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CreateViewRelation *this,idx_t depth)

{
  long lVar1;
  long *plVar2;
  Relation *pRVar3;
  long *plVar4;
  size_type *psVar5;
  string str;
  long *local_68;
  long local_58;
  long lStack_50;
  string local_48;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_48,(Relation *)depth,depth);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
    local_68 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar3->_vptr_Relation[6])(&local_48,pRVar3,depth + 1);
  plVar2 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string CreateViewRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Create View\n";
	return str + child->ToString(depth + 1);
}